

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O1

int ggml_backend_sched_backend_id_from_cur(ggml_backend_sched_t sched,ggml_tensor *tensor)

{
  ggml_backend_buffer_type_t pgVar1;
  _func__Bool_ggml_backend_buffer_type_t *p_Var2;
  ggml_backend_dev_t pgVar3;
  _func__Bool_ggml_backend_dev_t_ggml_tensor_ptr *p_Var4;
  bool bVar5;
  _Bool _Var6;
  int iVar7;
  uint uVar8;
  ggml_tensor *pgVar9;
  char *pcVar10;
  char *pcVar11;
  ulong unaff_RBP;
  int i;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  
  iVar7 = ggml_backend_sched_backend_from_buffer(sched,tensor,tensor);
  if ((iVar7 == -1) &&
     ((tensor->view_src == (ggml_tensor *)0x0 ||
      (iVar7 = ggml_backend_sched_backend_from_buffer(sched,tensor->view_src,tensor), iVar7 == -1)))
     ) {
    if ((tensor->buffer != (ggml_backend_buffer *)0x0) ||
       ((tensor->view_src != (ggml_tensor *)0x0 &&
        (tensor->view_src->buffer != (ggml_backend_buffer *)0x0)))) {
      pgVar9 = tensor->view_src;
      if (tensor->view_src == (ggml_tensor *)0x0) {
        pgVar9 = tensor;
      }
      pgVar1 = pgVar9->buffer->buft;
      pcVar10 = (*(pgVar1->iface).get_name)(pgVar1);
      pcVar11 = ggml_op_name(tensor->op);
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-backend.cpp"
                 ,0x2ec,
                 "pre-allocated tensor (%s) in a buffer (%s) that cannot run the operation (%s)",
                 tensor->name,pcVar10,pcVar11);
    }
    if ((tensor->flags & 1) == 0) {
      lVar12 = 0;
      do {
        pgVar9 = tensor->src[lVar12];
        if (pgVar9 == (ggml_tensor *)0x0) {
          bVar5 = false;
        }
        else {
          bVar5 = false;
          if (((tensor->op != GGML_OP_ROPE) && (pgVar9->buffer != (ggml_backend_buffer *)0x0)) &&
             (pgVar9->buffer->usage == GGML_BACKEND_BUFFER_USAGE_WEIGHTS)) {
            uVar8 = ggml_backend_sched_backend_from_buffer(sched,pgVar9,tensor);
            if (uVar8 == sched->n_backends - 1U) {
              pgVar1 = pgVar9->buffer->buft;
              p_Var2 = (pgVar1->iface).is_host;
              if ((p_Var2 != (_func__Bool_ggml_backend_buffer_type_t *)0x0) &&
                 (_Var6 = (*p_Var2)(pgVar1), _Var6)) {
                bVar14 = 0 < (int)uVar8;
                if (0 < (int)uVar8) {
                  uVar13 = 0;
                  do {
                    pgVar3 = sched->backends[uVar13]->device;
                    _Var6 = (*(pgVar3->iface).supports_op)(pgVar3,tensor);
                    if (_Var6) {
                      pgVar3 = sched->backends[uVar13]->device;
                      p_Var4 = (pgVar3->iface).offload_op;
                      if ((p_Var4 != (_func__Bool_ggml_backend_dev_t_ggml_tensor_ptr *)0x0) &&
                         (_Var6 = (*p_Var4)(pgVar3,tensor), _Var6)) {
                        unaff_RBP = uVar13 & 0xffffffff;
                        break;
                      }
                    }
                    uVar13 = uVar13 + 1;
                    bVar14 = uVar13 < uVar8;
                  } while (uVar13 != uVar8);
                }
                bVar5 = true;
                if (bVar14) goto LAB_00128d32;
              }
            }
            bVar5 = true;
            unaff_RBP = (ulong)uVar8;
          }
        }
LAB_00128d32:
        if (bVar5) {
          return (int)unaff_RBP;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 10);
      iVar7 = -1;
    }
    else {
      iVar7 = sched->n_backends + -1;
    }
  }
  return iVar7;
}

Assistant:

static int ggml_backend_sched_backend_id_from_cur(ggml_backend_sched_t sched, struct ggml_tensor * tensor) {
    // assign pre-allocated nodes to their backend
    int cur_backend_id = ggml_backend_sched_backend_from_buffer(sched, tensor, tensor);
    if (cur_backend_id != -1) {
        SET_CAUSE(tensor, "1.dst");
        return cur_backend_id;
    }

    // view_src
    if (tensor->view_src != NULL) {
        cur_backend_id = ggml_backend_sched_backend_from_buffer(sched, tensor->view_src, tensor);
        if (cur_backend_id != -1) {
            SET_CAUSE(tensor, "1.vsrc");
            return cur_backend_id;
        }
    }

    if (tensor->buffer || (tensor->view_src && tensor->view_src->buffer)) {
        // since the tensor is pre-allocated, it cannot be moved to another backend
        ggml_backend_buffer_t buffer = tensor->view_src ? tensor->view_src->buffer : tensor->buffer;
        GGML_ABORT("pre-allocated tensor (%s) in a buffer (%s) that cannot run the operation (%s)", tensor->name, ggml_backend_buffer_name(buffer), ggml_op_name(tensor->op));
    }

    // graph input
    if (tensor->flags & GGML_TENSOR_FLAG_INPUT) {
        cur_backend_id = sched->n_backends - 1; // last backend (assumed CPU)
        SET_CAUSE(tensor, "1.inp");
        return cur_backend_id;
    }

    // operations with weights are preferably run on the same backend as the weights
    for (int i = 0; i < GGML_MAX_SRC; i++) {
        const struct ggml_tensor * src = tensor->src[i];
        if (src == NULL) {
            continue;
        }
        // skip ROPE since the rope freqs tensor is too small to choose a backend based on it
        // not an ideal solution
        if (tensor->op != GGML_OP_ROPE && src->buffer != NULL && src->buffer->usage == GGML_BACKEND_BUFFER_USAGE_WEIGHTS) {
            int src_backend_id = ggml_backend_sched_backend_from_buffer(sched, src, tensor);
            // check if a backend with higher prio wants to offload the op
            if (src_backend_id == sched->n_backends - 1 && ggml_backend_buffer_is_host(src->buffer)) {
                for (int b = 0; b < src_backend_id; b++) {
                    if (ggml_backend_supports_op(sched->backends[b], tensor) && ggml_backend_offload_op(sched->backends[b], tensor)) {
                        SET_CAUSE(tensor, "1.off");
                        return b;
                    }
                }
            }
            SET_CAUSE(tensor, "1.wgt%d", i);
            return src_backend_id;
        }
    }

    return -1;
}